

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

int read_item(char **pp,char *end,string *buf,bool left)

{
  byte *__first;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *__last;
  ulong uVar4;
  
  iVar2 = skip_blank(pp,end);
  if (iVar2 == 0x100) {
    buf->_M_string_length = 0;
    *(buf->_M_dataplus)._M_p = '\0';
    return 0x100;
  }
  __first = (byte *)*pp;
  bVar1 = 0x23;
  if (left) {
    bVar1 = 0x3d;
  }
  __last = (byte *)0x0;
  pbVar3 = __first;
  do {
    if (pbVar3 == (byte *)end) {
      if (__last == (byte *)0x0) {
        __last = (byte *)end;
      }
      *pp = end;
      if (__last == (byte *)0x0) {
        __assert_fail("value_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                      ,0x101,"int read_item(const char **, const char *, std::string &, bool)");
      }
LAB_00156641:
      std::__cxx11::string::assign<char_const*,void>((string *)buf,(char *)__first,(char *)__last);
      iVar2 = skip_blank(pp,end);
      return iVar2;
    }
    uVar4 = (ulong)*pbVar3;
    if (uVar4 < 0x3c) {
      if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x800000000002400U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_0015661a;
        goto LAB_00156626;
      }
      if (__last == (byte *)0x0) {
        __last = pbVar3;
      }
    }
    else {
LAB_0015661a:
      if (*pbVar3 == bVar1) {
LAB_00156626:
        if (__last == (byte *)0x0) {
          __last = pbVar3;
        }
        *pp = (char *)pbVar3;
        goto LAB_00156641;
      }
      __last = (byte *)0x0;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

static int read_item(const char** pp, const char* end, std::string& buf, bool left)
{
	int c = skip_blank(pp, end);
	if (c == IF_EOL) {
		buf.clear();
		return c;
	}
	const char* value = *pp;
	const char* value_end = 0;
	for (const char* p = value;; ++p) {
		if (p == end) {
			if (value_end == 0)
				value_end = end;
			*pp = end;
			break;
		}
		c = *p;
		if (c == ' ' || c =='\t') {
			if (value_end == 0)
				value_end = p;
		} else if (c == '\n' || c == '\r' || c == ';' || (!left && c == '#') || (left && c == '=')) {
			if (value_end == 0)
				value_end = p;
			*pp = p;
			break;
		} else {
			value_end = 0;
		}
	}
	xr_assert(value_end);
	buf.assign(value, value_end);
	return skip_blank(pp, end);
}